

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O1

Def * cmDefinitions::GetInternal(string *key,StackIter begin,StackIter end,bool raise)

{
  StackIter begin_00;
  bool bVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  _Var2;
  Def *__b;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDefinitions::Def>,std::allocator<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>,_bool>
  pVar4;
  StackIter it;
  iterator local_98;
  iterator local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>
  local_78;
  
  local_98.Position = begin.Position;
  local_98.Tree = begin.Tree;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_98,end);
  if (!bVar1) {
    __assert_fail("begin != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmDefinitions.cxx"
                  ,0xf,
                  "static const cmDefinitions::Def &cmDefinitions::GetInternal(const std::string &, StackIter, StackIter, bool)"
                 );
  }
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)cmLinkedTree<cmDefinitions>::iterator::operator->(&local_98);
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this,key);
  cmLinkedTree<cmDefinitions>::iterator::operator->(&local_98);
  if (_Var2._M_cur == (__node_type *)0x0) {
    local_88.Tree = local_98.Tree;
    local_88.Position = local_98.Position;
    cmLinkedTree<cmDefinitions>::iterator::operator++(&local_88);
    bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator==(&local_88,end);
    if (bVar1) {
      return &NoDef;
    }
    begin_00.Position = local_88.Position;
    begin_00.Tree = local_88.Tree;
    __b = GetInternal(key,begin_00,end,raise);
    if (!raise) {
      return __b;
    }
    p_Var3 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDefinitions::Def>,std::allocator<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)cmLinkedTree<cmDefinitions>::iterator::operator->(&local_98);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_true>
              (&local_78,key,__b);
    pVar4 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDefinitions::Def>,std::allocator<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>(p_Var3,&local_78)
    ;
    _Var2._M_cur = (__node_type *)
                   pVar4.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
                   ._M_cur;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.second.super_string._M_dataplus._M_p != &local_78.second.super_string.field_2) {
      operator_delete(local_78.second.super_string._M_dataplus._M_p,
                      local_78.second.super_string.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined1 *)((long)_Var2._M_cur + 0x49) = 1;
  }
  return (Def *)((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>
                        ._M_storage._M_storage + 0x20);
}

Assistant:

cmDefinitions::Def const& cmDefinitions::GetInternal(const std::string& key,
                                                     StackIter begin,
                                                     StackIter end, bool raise)
{
  assert(begin != end);
  MapType::iterator i = begin->Map.find(key);
  if (i != begin->Map.end()) {
    i->second.Used = true;
    return i->second;
  }
  StackIter it = begin;
  ++it;
  if (it == end) {
    return cmDefinitions::NoDef;
  }
  Def const& def = cmDefinitions::GetInternal(key, it, end, raise);
  if (!raise) {
    return def;
  }
  return begin->Map.insert(MapType::value_type(key, def)).first->second;
}